

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O1

void gen_mtfsf(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i32 pTVar2;
  TCGTemp *ts;
  uint uVar3;
  int32_t val;
  uintptr_t o;
  TCGTemp *args [1];
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  if (ctx->fpu_enabled == false) {
    gen_exception(ctx,7);
    return;
  }
  uVar1 = ctx->opcode;
  uVar3 = uVar1 >> 0x10 & 1;
  if (uVar3 == 0 || (ctx->insns_flags2 & 0x20) != 0) {
    tcg_ctx = ctx->uc->tcg_ctx;
    local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    tcg_gen_callN_ppc64(tcg_ctx,helper_reset_fpstatus,(TCGTemp *)0x0,1,&local_48);
    if ((uVar1 >> 0x19 & 1) == 0) {
      val = (uVar1 >> 0x11 & 0xff) << (sbyte)(uVar3 << 3);
    }
    else {
      val = 0xffff;
      if ((ctx->insns_flags2 & 0x20) == 0) {
        val = 0xff;
      }
    }
    pTVar2 = tcg_const_i32_ppc64(tcg_ctx,val);
    ts = tcg_temp_new_internal_ppc64(tcg_ctx,TCG_TYPE_I64,false);
    tcg_gen_op3_ppc64(tcg_ctx,INDEX_op_ld_i64,(TCGArg)ts,(TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
                      (ulong)(ctx->opcode >> 7 & 0x1f0) + 0x12b28);
    local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_40 = ts;
    local_38 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
    tcg_gen_callN_ppc64(tcg_ctx,helper_store_fpscr,(TCGTemp *)0x0,3,&local_48);
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
    if ((ctx->opcode & 1) != 0) {
      gen_mtfsf_cold_1();
    }
    local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    tcg_gen_callN_ppc64(tcg_ctx,helper_float_check_status,(TCGTemp *)0x0,1,&local_48);
    tcg_temp_free_internal_ppc64(tcg_ctx,ts);
    return;
  }
  gen_exception_err(ctx,0x60,0x21);
  return;
}

Assistant:

static void gen_mtfsf(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t0;
    TCGv_i64 t1;
    int flm, l, w;

    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }
    flm = FPFLM(ctx->opcode);
    l = FPL(ctx->opcode);
    w = FPW(ctx->opcode);
    if (unlikely(w & !(ctx->insns_flags2 & PPC2_ISA205))) {
        gen_inval_exception(ctx, POWERPC_EXCP_INVAL_INVAL);
        return;
    }
    gen_reset_fpstatus(tcg_ctx);
    if (l) {
        t0 = tcg_const_i32(tcg_ctx, (ctx->insns_flags2 & PPC2_ISA205) ? 0xffff : 0xff);
    } else {
        t0 = tcg_const_i32(tcg_ctx, flm << (w * 8));
    }
    t1 = tcg_temp_new_i64(tcg_ctx);
    get_fpr(tcg_ctx, t1, rB(ctx->opcode));
    gen_helper_store_fpscr(tcg_ctx, tcg_ctx->cpu_env, t1, t0);
    tcg_temp_free_i32(tcg_ctx, t0);
    if (unlikely(Rc(ctx->opcode) != 0)) {
        tcg_gen_trunc_tl_i32(tcg_ctx, cpu_crf[1], cpu_fpscr);
        tcg_gen_shri_i32(tcg_ctx, cpu_crf[1], cpu_crf[1], FPSCR_OX);
    }
    /* We can raise a deferred exception */
    gen_helper_float_check_status(tcg_ctx, tcg_ctx->cpu_env);
    tcg_temp_free_i64(tcg_ctx, t1);
}